

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

BBox3fa * __thiscall embree::SceneGraph::PointSetNode::bounds(PointSetNode *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  long in_RSI;
  BBox3fa *in_RDI;
  float fVar3;
  Vec3fx *x;
  const_iterator __end3;
  const_iterator __begin3;
  vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *__range3;
  vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *p;
  const_iterator __end2;
  const_iterator __begin2;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *__range2;
  BBox3fa *b;
  BBox3fa *this_00;
  BBox3fa *__lhs;
  undefined8 local_218;
  undefined8 uStack_210;
  anon_union_16_2_47237d3f_for_Vec3fx_0 *local_200;
  anon_union_16_2_47237d3f_for_Vec3fx_0 *local_1f8;
  anon_union_16_2_47237d3f_for_Vec3fx_0 *local_1f0;
  reference local_1e8;
  reference local_1e0;
  vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *local_1d8;
  __normal_iterator<const_embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>_>
  local_1d0;
  long local_1c8;
  anon_union_16_2_47237d3f_for_Vec3fx_0 *local_1a8;
  undefined8 *local_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 *local_180;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_154;
  Vec3fa *local_150;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  undefined1 *local_128;
  undefined1 *local_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 *local_f0;
  undefined8 *local_e0;
  Vec3fa *local_d8;
  undefined8 *local_d0;
  undefined8 *local_c0;
  undefined8 *local_b0;
  undefined1 local_a8 [16];
  undefined8 *local_98;
  undefined8 *local_90;
  Vec3fa *local_88;
  undefined8 *local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  undefined8 *local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  reference local_10;
  reference local_8;
  
  local_128 = &pos_inf;
  this_00 = in_RDI;
  __lhs = in_RDI;
  local_168 = std::numeric_limits<float>::infinity();
  *(ulong *)&(in_RDI->lower).field_0 = CONCAT44(local_168,local_168);
  *(ulong *)((long)&(in_RDI->lower).field_0 + 8) = CONCAT44(local_168,local_168);
  local_120 = &neg_inf;
  fStack_164 = local_168;
  fStack_160 = local_168;
  fStack_15c = local_168;
  local_154 = local_168;
  local_150 = &in_RDI->upper;
  fVar3 = std::numeric_limits<float>::infinity();
  local_148 = -fVar3;
  *(ulong *)&(in_RDI->upper).field_0 = CONCAT44(fVar3,fVar3) ^ 0x8000000080000000;
  *(ulong *)((long)&(in_RDI->upper).field_0 + 8) = CONCAT44(fVar3,fVar3) ^ 0x8000000080000000;
  local_1c8 = in_RSI + 0x78;
  fStack_144 = local_148;
  fStack_140 = local_148;
  fStack_13c = local_148;
  local_138 = local_148;
  local_1d0._M_current =
       (vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *)
       std::
       vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
       ::begin((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                *)this_00);
  local_1d8 = (vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *)
              std::
              vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
              ::end((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                     *)this_00);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>_>
                        *)__lhs,(__normal_iterator<const_embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>_>
                                 *)this_00);
    if (!bVar2) break;
    local_1e8 = __gnu_cxx::
                __normal_iterator<const_embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>_>
                ::operator*(&local_1d0);
    local_1f8 = &local_1e8->items[local_1e8->size_active].field_0;
    for (local_1f0 = &local_1e8->items->field_0; local_1f0 != local_1f8; local_1f0 = local_1f0 + 1)
    {
      local_200 = local_1f0;
      local_1a0 = &local_218;
      local_1a8 = local_1f0;
      local_198 = *(undefined8 *)local_1f0;
      uStack_190 = *(undefined8 *)(local_1f0->m128 + 2);
      local_180 = &local_218;
      local_f0 = &local_218;
      local_b0 = &local_108;
      local_28 = *(undefined8 *)&(this_00->lower).field_0;
      uStack_20 = *(undefined8 *)((long)&(this_00->lower).field_0 + 8);
      local_a8 = minps((undefined1  [16])(this_00->lower).field_0,
                       (undefined1  [16])*(__m128 *)local_1f0);
      local_98 = &local_108;
      local_108 = local_a8._0_8_;
      uStack_100 = local_a8._8_8_;
      local_d0 = &local_108;
      *(undefined8 *)&(this_00->lower).field_0 = local_a8._0_8_;
      *(undefined8 *)((long)&(this_00->lower).field_0 + 8) = local_a8._8_8_;
      local_88 = &this_00->upper;
      local_80 = &local_118;
      local_68 = *(undefined8 *)&local_88->field_0;
      uStack_60 = *(undefined8 *)((long)&(this_00->upper).field_0 + 8);
      local_78 = local_218;
      uStack_70 = uStack_210;
      auVar1._8_8_ = uStack_210;
      auVar1._0_8_ = local_218;
      local_58 = maxps((undefined1  [16])local_88->field_0,auVar1);
      local_40 = &local_118;
      local_118 = local_58._0_8_;
      uStack_110 = local_58._8_8_;
      local_d8 = &this_00->upper;
      local_e0 = &local_118;
      *(undefined8 *)&local_d8->field_0 = local_58._0_8_;
      *(undefined8 *)((long)&(this_00->upper).field_0 + 8) = local_58._8_8_;
      local_c0 = local_f0;
      local_90 = local_f0;
      local_38 = local_198;
      uStack_30 = uStack_190;
      local_218 = local_198;
      uStack_210 = uStack_190;
    }
    local_1e0 = local_1e8;
    local_10 = local_1e8;
    local_8 = local_1e8;
    __gnu_cxx::
    __normal_iterator<const_embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>_>
    ::operator++(&local_1d0);
  }
  return __lhs;
}

Assistant:

virtual BBox3fa bounds() const
      {
        BBox3fa b = empty;
        for (const auto& p : positions)
          for (auto& x : p)
            b.extend(x);
        return b;
      }